

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O2

Regexp * __thiscall
duckdb_re2::Regexp::Walker<duckdb_re2::Regexp_*>::WalkInternal
          (Walker<duckdb_re2::Regexp_*> *this,Regexp *re,Regexp *top_arg,bool use_copy)

{
  stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
  *this_00;
  ushort uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Elt_pointer pWVar5;
  Regexp **ppRVar6;
  Regexp *pRVar7;
  ulong uVar8;
  bool stop;
  undefined1 local_1b0 [8];
  int local_1a8;
  Regexp *local_1a0;
  Regexp **local_188;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::operator<<((ostream *)&local_1a8,"Walk NULL");
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  }
  else {
    this_00 = &this->stack_;
    local_1a8 = -1;
    local_188 = (Regexp **)0x0;
    local_1b0 = (undefined1  [8])re;
    local_1a0 = top_arg;
    std::
    deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
    ::emplace_back<duckdb_re2::WalkState<duckdb_re2::Regexp*>>
              ((deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
                *)this_00,(WalkState<duckdb_re2::Regexp_*> *)local_1b0);
LAB_01b2cc06:
    while( true ) {
      pWVar5 = (this->stack_).c.
               super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar5 == (this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar5 = (this->stack_).c.
                 super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      pRVar7 = pWVar5[-1].re;
      uVar8 = (ulong)(uint)pWVar5[-1].n;
      if (pWVar5[-1].n == 0xffffffff) break;
LAB_01b2cc2b:
      uVar1 = pRVar7->nsub_;
      if (uVar1 == 0) {
LAB_01b2cd0e:
        iVar3 = (*this->_vptr_Walker[3])
                          (this,pRVar7,pWVar5[-1].parent_arg,pWVar5[-1].pre_arg,
                           pWVar5[-1].child_args);
        top_arg = (Regexp *)CONCAT44(extraout_var_01,iVar3);
        if ((1 < pRVar7->nsub_) && (pWVar5[-1].child_args != (Regexp **)0x0)) {
          operator_delete__(pWVar5[-1].child_args);
        }
        goto LAB_01b2cd5e;
      }
      if (uVar1 == 1) {
        paVar4 = &pRVar7->field_5;
      }
      else {
        paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar7->field_5).submany_;
      }
      iVar3 = (int)uVar8;
      if ((int)(uint)uVar1 <= iVar3) goto LAB_01b2cd0e;
      if (use_copy && 0 < iVar3) {
        pRVar7 = (Regexp *)paVar4[uVar8].submany_;
        if ((Regexp *)paVar4[iVar3 - 1U].submany_ != pRVar7) goto LAB_01b2cdb0;
        iVar2 = (*this->_vptr_Walker[4])(this,pWVar5[-1].child_args[iVar3 - 1U]);
        iVar3 = pWVar5[-1].n;
        pWVar5[-1].child_args[iVar3] = (Regexp *)CONCAT44(extraout_var_00,iVar2);
        pWVar5[-1].n = iVar3 + 1;
      }
      else {
        pRVar7 = (Regexp *)paVar4[iVar3].submany_;
LAB_01b2cdb0:
        local_1a0 = pWVar5[-1].pre_arg;
        local_1a8 = -1;
        local_188 = (Regexp **)0x0;
        local_1b0 = (undefined1  [8])pRVar7;
        std::
        deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
        ::emplace_back<duckdb_re2::WalkState<duckdb_re2::Regexp*>>
                  ((deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
                    *)this_00,(WalkState<duckdb_re2::Regexp_*> *)local_1b0);
      }
    }
    iVar3 = this->max_visits_;
    this->max_visits_ = iVar3 + -1;
    if (iVar3 < 1) {
      this->stopped_early_ = true;
      iVar3 = (*this->_vptr_Walker[5])(this,pRVar7,pWVar5[-1].parent_arg);
      top_arg = (Regexp *)CONCAT44(extraout_var_02,iVar3);
    }
    else {
      local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
      iVar3 = (*this->_vptr_Walker[2])(this,pRVar7,pWVar5[-1].parent_arg,local_1b0);
      top_arg = (Regexp *)CONCAT44(extraout_var,iVar3);
      pWVar5[-1].pre_arg = top_arg;
      if (local_1b0[0] == '\0') {
        pWVar5[-1].n = 0;
        pWVar5[-1].child_args = (Regexp **)0x0;
        uVar1 = pRVar7->nsub_;
        uVar8 = (ulong)uVar1;
        if (uVar1 != 0) {
          if (uVar1 == 1) {
            pWVar5[-1].child_args = &pWVar5[-1].child_arg;
            uVar8 = 0;
          }
          else {
            ppRVar6 = (Regexp **)operator_new__((ulong)uVar1 << 3);
            pWVar5[-1].child_args = ppRVar6;
            uVar8 = (ulong)(uint)pWVar5[-1].n;
          }
        }
        goto LAB_01b2cc2b;
      }
    }
LAB_01b2cd5e:
    std::
    deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
    ::pop_back(&this_00->c);
    pWVar5 = (this->stack_).c.
             super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar5 != (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pWVar5 == (this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar5 = (this->stack_).c.
                 super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      if (pWVar5[-1].child_args == (Regexp **)0x0) {
        pWVar5[-1].child_arg = top_arg;
        iVar3 = pWVar5[-1].n;
      }
      else {
        iVar3 = pWVar5[-1].n;
        pWVar5[-1].child_args[iVar3] = top_arg;
      }
      pWVar5[-1].n = iVar3 + 1;
      goto LAB_01b2cc06;
    }
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}